

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
       *this,BinaryReader<mp::internal::IdentityConverter> *bound_reader)

{
  StringRef name_00;
  bool bVar1;
  long in_RSI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
  *in_RDI;
  int info;
  StringRef name;
  int num_args;
  int type;
  int index_3;
  LinearExprHandler expr_handler;
  int position;
  int num_linear_terms;
  int expr_index;
  NumericExpr expr;
  int obj_type;
  int index_2;
  int index_1;
  int index;
  char c;
  bool read_bounds;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
  *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  BinaryReader<mp::internal::IdentityConverter> *in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
  *in_stack_ffffffffffffff10;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
  *in_stack_ffffffffffffff18;
  CStringRef in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  VarBoundHandler<ExprCounter> *in_stack_ffffffffffffff48;
  int info_00;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  BasicCStringRef<char> local_98;
  BasicCStringRef<char> local_90;
  BasicCStringRef<char> local_88;
  BasicCStringRef<char> local_80;
  uint local_74;
  char *local_70;
  size_t local_68;
  StringRef local_60;
  int local_4c;
  BasicCStringRef<char> local_48;
  int local_40;
  int local_3c;
  int local_34;
  int local_30;
  int local_2c;
  NumericExpr local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  char local_12;
  byte local_11;
  long local_10;
  
  local_11 = in_RSI == 0;
  in_RDI->num_vars_and_exprs_ =
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons
       + (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.
         num_common_exprs_in_single_objs;
  local_10 = in_RSI;
  do {
    local_12 = ReaderBase::ReadChar((ReaderBase *)in_RDI->reader_);
    switch(local_12) {
    case '\0':
      bVar1 = ReaderBase::IsEOF((ReaderBase *)0x10f341);
      if (bVar1) {
        if ((local_11 & 1) != 0) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_90,"segment \'b\' missing");
          BinaryReaderBase::ReportError<>
                    ((BinaryReaderBase *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
        }
        return;
      }
    default:
      in_stack_fffffffffffffef0 =
           (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
            *)in_RDI->reader_;
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_98,"invalid segment type");
      BinaryReaderBase::ReportError<>
                ((BinaryReaderBase *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
      break;
    case 'C':
      local_18 = ReadUInt(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      in_stack_ffffffffffffff48 = in_RDI->handler_;
      in_stack_ffffffffffffff54 = local_18;
      ReadNumericExpr(in_stack_fffffffffffffef0,SUB41((uint)in_stack_fffffffffffffeec >> 0x18,0));
      NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnAlgebraicCon
                ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff00,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (NumericExpr)in_stack_fffffffffffffef8);
      break;
    case 'F':
      local_3c = ReadUInt(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      local_40 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_ffffffffffffff00);
      if ((local_40 != 0) && (local_40 != 1)) {
        in_stack_ffffffffffffff18 =
             (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
              *)in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_48,"invalid function type");
        BinaryReaderBase::ReportError<>
                  ((BinaryReaderBase *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
      }
      local_4c = BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffef0);
      local_60 = BinaryReader<mp::internal::IdentityConverter>::ReadName
                           ((BinaryReader<mp::internal::IdentityConverter> *)0x10f0df);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      local_70 = local_60.data_;
      local_68 = local_60.size_;
      name_00.data_._4_4_ = in_stack_ffffffffffffff0c;
      name_00.data_._0_4_ = in_stack_ffffffffffffff08;
      name_00.size_ = (size_t)in_stack_ffffffffffffff10;
      NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnFunction
                ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff00,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),name_00,
                 (int)in_stack_fffffffffffffef8,(Type)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      break;
    case 'G':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::ObjHandler>
                (in_stack_ffffffffffffff10);
      break;
    case 'J':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::AlgebraicConHandler>
                (in_stack_ffffffffffffff10);
      break;
    case 'K':
      ReadColumnSizes<false>(in_stack_ffffffffffffff10);
      break;
    case 'L':
      local_1c = ReadUInt(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      in_stack_ffffffffffffff44 = local_1c;
      ReadLogicalExpr(in_stack_ffffffffffffff18);
      NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnLogicalCon
                ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff00,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (LogicalExpr)in_stack_fffffffffffffef8);
      break;
    case 'O':
      local_20 = ReadUInt(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      local_24 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_ffffffffffffff00);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      local_28 = ReadNumericExpr(in_stack_fffffffffffffef0,
                                 SUB41((uint)in_stack_fffffffffffffeec >> 0x18,0));
      bVar1 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::NeedObj
                        ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffeec);
      if (bVar1) {
        NLHandler<mp::NullNLHandler<Expr>,_Expr>::resulting_obj_index
                  ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_RDI->handler_,local_20);
        NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnObj
                  ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff00,
                   (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(Type)in_stack_fffffffffffffef8,
                   (NumericExpr)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      }
      break;
    case 'S':
      local_74 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_ffffffffffffff00);
      if (7 < (int)local_74) {
        in_stack_ffffffffffffff10 =
             (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
              *)in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_80,"invalid suffix kind");
        BinaryReaderBase::ReportError<>
                  ((BinaryReaderBase *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
      }
      in_stack_ffffffffffffff08 = local_74 & 3;
      in_stack_ffffffffffffff0c = 0;
      info_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      switch(in_stack_ffffffffffffff08) {
      case 0:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                    *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),info_00);
        break;
      case 1:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::ConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                    *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),info_00);
        break;
      case 2:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::ObjHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                    *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),info_00);
        break;
      case 3:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::ProblemHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                    *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),info_00);
      }
      break;
    case 'V':
      local_2c = ReadUInt(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                          in_stack_ffffffffffffff08);
      local_2c = local_2c - (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      local_30 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_ffffffffffffff00);
      local_34 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_ffffffffffffff00);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      NLHandler<mp::NullNLHandler<Expr>,_Expr>::BeginCommonExpr
                ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      if (local_30 != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
        ::ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::LinearExprHandler>
                  (in_RDI,local_30);
      }
      in_stack_ffffffffffffff20.data_ = (char *)in_RDI->handler_;
      ReadNumericExpr(in_stack_fffffffffffffef0,SUB41((uint)in_stack_fffffffffffffeec >> 0x18,0));
      NLHandler<mp::NullNLHandler<Expr>,_Expr>::EndCommonExpr
                ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff00,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (NumericExpr)in_stack_fffffffffffffef8,
                 (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      break;
    case 'b':
      if ((local_11 & 1) == 0) {
        if (local_10 == 0) {
          in_stack_ffffffffffffff00 = in_RDI->reader_;
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_88,"duplicate \'b\' segment");
          BinaryReaderBase::ReportError<>
                    ((BinaryReaderBase *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
        }
        BinaryReader<mp::internal::IdentityConverter>::operator=
                  ((BinaryReader<mp::internal::IdentityConverter> *)in_stack_fffffffffffffef0,
                   (BinaryReader<mp::internal::IdentityConverter> *)
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        local_10 = 0;
      }
      else {
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        ReaderBase::ptr((ReaderBase *)in_RDI->reader_);
        if ((in_RDI->flags_ & 1U) != 0) {
          return;
        }
        local_11 = 0;
      }
      break;
    case 'd':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                  *)in_stack_ffffffffffffff20.data_);
      break;
    case 'k':
      ReadColumnSizes<true>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                  *)in_stack_ffffffffffffff20.data_);
      break;
    case 'r':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
      ::
      ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::AlgebraicConHandler>
                (in_RDI);
      break;
    case 'x':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprCounter>>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                  *)in_stack_ffffffffffffff20.data_);
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}